

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

char * __thiscall
cmGeneratorTarget::GetOutputTargetType(cmGeneratorTarget *this,ArtifactType artifact)

{
  bool bVar1;
  uint uVar2;
  TargetType TVar3;
  cmGlobalGenerator *pcVar4;
  ArtifactType local_1c;
  ArtifactType artifact_local;
  cmGeneratorTarget *this_local;
  
  bVar1 = IsFrameworkOnApple(this);
  if (!bVar1) {
    pcVar4 = GetGlobalGenerator(this);
    uVar2 = (*pcVar4->_vptr_cmGlobalGenerator[0x29])();
    local_1c = artifact;
    if ((uVar2 & 1) == 0) goto LAB_009d2ad2;
  }
  local_1c = RuntimeBinaryArtifact;
LAB_009d2ad2:
  TVar3 = GetType(this);
  switch(TVar3) {
  case EXECUTABLE:
    if (local_1c == RuntimeBinaryArtifact) {
      this_local = (cmGeneratorTarget *)0x115b47e;
      return (char *)this_local;
    }
    if (local_1c == ImportLibraryArtifact) {
      this_local = (cmGeneratorTarget *)0x11a1d40;
      return (char *)this_local;
    }
    break;
  case STATIC_LIBRARY:
    this_local = (cmGeneratorTarget *)0x11a1d40;
    return (char *)this_local;
  case SHARED_LIBRARY:
    bVar1 = IsDLLPlatform(this);
    if (bVar1) {
      if (local_1c == RuntimeBinaryArtifact) {
        this_local = (cmGeneratorTarget *)0x115b47e;
        return (char *)this_local;
      }
      if (local_1c == ImportLibraryArtifact) {
        this_local = (cmGeneratorTarget *)0x11a1d40;
        return (char *)this_local;
      }
    }
    else {
      if (local_1c == RuntimeBinaryArtifact) {
        this_local = (cmGeneratorTarget *)0x1169530;
        return (char *)this_local;
      }
      if (local_1c == ImportLibraryArtifact) {
        this_local = (cmGeneratorTarget *)0x11a1d40;
        return (char *)this_local;
      }
    }
    break;
  case MODULE_LIBRARY:
    if (local_1c == RuntimeBinaryArtifact) {
      this_local = (cmGeneratorTarget *)0x1169530;
      return (char *)this_local;
    }
    if (local_1c == ImportLibraryArtifact) {
      this_local = (cmGeneratorTarget *)0x11a1d40;
      return (char *)this_local;
    }
    break;
  case OBJECT_LIBRARY:
    this_local = (cmGeneratorTarget *)0x114f99d;
    return (char *)this_local;
  }
  this_local = (cmGeneratorTarget *)0x1198ba7;
  return (char *)this_local;
}

Assistant:

const char* cmGeneratorTarget::GetOutputTargetType(
  cmStateEnums::ArtifactType artifact) const
{
  if (this->IsFrameworkOnApple() || this->GetGlobalGenerator()->IsXcode()) {
    // import file (i.e. .tbd file) is always in same location as library
    artifact = cmStateEnums::RuntimeBinaryArtifact;
  }

  switch (this->GetType()) {
    case cmStateEnums::SHARED_LIBRARY:
      if (this->IsDLLPlatform()) {
        switch (artifact) {
          case cmStateEnums::RuntimeBinaryArtifact:
            // A DLL shared library is treated as a runtime target.
            return "RUNTIME";
          case cmStateEnums::ImportLibraryArtifact:
            // A DLL import library is treated as an archive target.
            return "ARCHIVE";
        }
      } else {
        switch (artifact) {
          case cmStateEnums::RuntimeBinaryArtifact:
            // For non-DLL platforms shared libraries are treated as
            // library targets.
            return "LIBRARY";
          case cmStateEnums::ImportLibraryArtifact:
            // Library import libraries are treated as archive targets.
            return "ARCHIVE";
        }
      }
      break;
    case cmStateEnums::STATIC_LIBRARY:
      // Static libraries are always treated as archive targets.
      return "ARCHIVE";
    case cmStateEnums::MODULE_LIBRARY:
      switch (artifact) {
        case cmStateEnums::RuntimeBinaryArtifact:
          // Module libraries are always treated as library targets.
          return "LIBRARY";
        case cmStateEnums::ImportLibraryArtifact:
          // Module import libraries are treated as archive targets.
          return "ARCHIVE";
      }
      break;
    case cmStateEnums::OBJECT_LIBRARY:
      // Object libraries are always treated as object targets.
      return "OBJECT";
    case cmStateEnums::EXECUTABLE:
      switch (artifact) {
        case cmStateEnums::RuntimeBinaryArtifact:
          // Executables are always treated as runtime targets.
          return "RUNTIME";
        case cmStateEnums::ImportLibraryArtifact:
          // Executable import libraries are treated as archive targets.
          return "ARCHIVE";
      }
      break;
    default:
      break;
  }
  return "";
}